

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_h_predictor_32x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  int y_mask;
  uint uVar39;
  uint8_t *puVar40;
  short sVar41;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  undefined1 auVar42 [16];
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  short sVar76;
  ushort uVar77;
  ushort uVar78;
  short sVar83;
  short sVar86;
  short sVar89;
  short sVar92;
  short sVar95;
  short sVar98;
  undefined1 auVar79 [16];
  ushort uVar84;
  ushort uVar85;
  ushort uVar87;
  ushort uVar88;
  ushort uVar90;
  ushort uVar91;
  ushort uVar93;
  ushort uVar94;
  ushort uVar96;
  ushort uVar97;
  ushort uVar99;
  ushort uVar100;
  short sVar101;
  ushort uVar102;
  ushort uVar103;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar104 [16];
  ushort uVar105;
  ushort uVar106;
  ushort uVar107;
  ushort uVar108;
  ushort uVar109;
  ushort uVar110;
  ushort uVar111;
  ushort uVar112;
  ushort uVar113;
  ushort uVar114;
  ushort uVar115;
  ushort uVar116;
  ushort uVar117;
  ushort uVar118;
  ushort uVar119;
  ushort uVar120;
  
  auVar42 = pshuflw(ZEXT116(top_row[0x1f]),ZEXT116(top_row[0x1f]),0);
  sVar48 = auVar42._0_2_;
  sVar49 = auVar42._2_2_;
  uVar1 = *(ulong *)left_column;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar7._8_4_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7._12_3_ = auVar3._12_3_;
  auVar11._8_2_ = 0;
  auVar11._0_8_ = uVar1;
  auVar11[10] = (char)(uVar1 >> 0x28);
  auVar11._11_4_ = auVar7._11_4_;
  auVar15._8_2_ = 0;
  auVar15._0_8_ = uVar1;
  auVar15._10_5_ = auVar11._10_5_;
  auVar19[8] = (char)(uVar1 >> 0x20);
  auVar19._0_8_ = uVar1;
  auVar19._9_6_ = auVar15._9_6_;
  auVar27._7_8_ = 0;
  auVar27._0_7_ = auVar19._8_7_;
  auVar31._1_8_ = SUB158(auVar27 << 0x40,7);
  auVar31[0] = (char)(uVar1 >> 0x18);
  auVar31._9_6_ = 0;
  auVar32._1_10_ = SUB1510(auVar31 << 0x30,5);
  auVar32[0] = (char)(uVar1 >> 0x10);
  auVar32._11_4_ = 0;
  auVar26[2] = (char)(uVar1 >> 8);
  auVar26._0_2_ = (ushort)uVar1;
  auVar26._3_12_ = SUB1512(auVar32 << 0x20,3);
  auVar42._0_2_ = (ushort)uVar1 & 0xff;
  auVar42._2_13_ = auVar26._2_13_;
  auVar42[0xf] = 0;
  sVar50 = sVar48 + 0x80;
  sVar51 = sVar49 * 0x10 + 0x80;
  sVar52 = sVar48 * 0x1f + 0x80;
  sVar53 = sVar49 * 0x2e + 0x80;
  sVar54 = sVar48 * 0x3c + 0x80;
  sVar55 = sVar49 * 0x4a + 0x80;
  sVar56 = sVar48 * 0x57 + 0x80;
  sVar57 = sVar49 * 99 + 0x80;
  sVar58 = sVar48 * 0x6f + 0x80;
  sVar59 = sVar49 * 0x7b + 0x80;
  sVar60 = sVar48 * 0x86 + 0x80;
  sVar61 = sVar49 * 0x91 + 0x80;
  sVar62 = sVar48 * 0x9b + 0x80;
  sVar63 = sVar49 * 0xa4 + 0x80;
  sVar64 = sVar48 * 0xad + 0x80;
  sVar65 = sVar49 * 0xb6 + 0x80;
  sVar66 = sVar48 * 0xbe + 0x80;
  sVar67 = sVar49 * 0xc5 + 0x80;
  sVar68 = sVar48 * 0xcc + 0x80;
  sVar69 = sVar49 * 0xd3 + 0x80;
  sVar70 = sVar48 * 0xd9 + 0x80;
  sVar71 = sVar49 * 0xde + 0x80;
  sVar72 = sVar48 * 0xe3 + 0x80;
  sVar73 = sVar49 * 0xe7 + 0x80;
  sVar41 = sVar48 * 0xeb + 0x80;
  sVar43 = sVar49 * 0xef + 0x80;
  sVar44 = sVar48 * 0xf2 + 0x80;
  sVar45 = sVar49 * 0xf4 + 0x80;
  sVar46 = sVar48 * 0xf6 + 0x80;
  sVar47 = sVar49 * 0xf7 + 0x80;
  sVar48 = sVar48 * 0xf8 + 0x80;
  sVar49 = sVar49 * 0xf8 + 0x80;
  puVar40 = dst + 0x10;
  for (uVar39 = 0x1000100; uVar39 < 0xf0e0f0f; uVar39 = uVar39 + 0x2020202) {
    auVar79._4_4_ = uVar39;
    auVar79._0_4_ = uVar39;
    auVar79._8_4_ = uVar39;
    auVar79._12_4_ = uVar39;
    auVar104 = pshufb(auVar42,auVar79);
    sVar76 = auVar104._0_2_;
    sVar83 = auVar104._2_2_;
    sVar86 = auVar104._4_2_;
    sVar89 = auVar104._6_2_;
    sVar92 = auVar104._8_2_;
    sVar95 = auVar104._10_2_;
    sVar98 = auVar104._12_2_;
    sVar101 = auVar104._14_2_;
    uVar77 = sVar76 * 0xff + sVar50;
    uVar84 = sVar83 * 0xf0 + sVar51;
    uVar87 = sVar86 * 0xe1 + sVar52;
    uVar90 = sVar89 * 0xd2 + sVar53;
    uVar93 = sVar92 * 0xc4 + sVar54;
    uVar96 = sVar95 * 0xb6 + sVar55;
    uVar99 = sVar98 * 0xa9 + sVar56;
    uVar102 = sVar101 * 0x9d + sVar57;
    uVar78 = uVar77 >> 8;
    uVar85 = uVar84 >> 8;
    uVar88 = uVar87 >> 8;
    uVar91 = uVar90 >> 8;
    uVar94 = uVar93 >> 8;
    uVar97 = uVar96 >> 8;
    uVar100 = uVar99 >> 8;
    uVar103 = uVar102 >> 8;
    uVar105 = sVar76 * 0x91 + sVar58;
    uVar107 = sVar83 * 0x85 + sVar59;
    uVar109 = sVar86 * 0x7a + sVar60;
    uVar111 = sVar89 * 0x6f + sVar61;
    uVar113 = sVar92 * 0x65 + sVar62;
    uVar115 = sVar95 * 0x5c + sVar63;
    uVar117 = sVar98 * 0x53 + sVar64;
    uVar119 = sVar101 * 0x4a + sVar65;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    puVar40[-0x10] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar40[-0xf] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
    puVar40[-0xe] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar40[-0xd] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar40[-0xc] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar40[-0xb] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
    puVar40[-10] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar40[-9] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
    puVar40[-8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar40[-7] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar40[-6] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar40[-5] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[-4] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[-3] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[-2] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[-1] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    uVar77 = sVar76 * 0x42 + sVar66;
    uVar84 = sVar83 * 0x3b + sVar67;
    uVar87 = sVar86 * 0x34 + sVar68;
    uVar90 = sVar89 * 0x2d + sVar69;
    uVar93 = sVar92 * 0x27 + sVar70;
    uVar96 = sVar95 * 0x22 + sVar71;
    uVar99 = sVar98 * 0x1d + sVar72;
    uVar102 = sVar101 * 0x19 + sVar73;
    uVar78 = uVar77 >> 8;
    uVar85 = uVar84 >> 8;
    uVar88 = uVar87 >> 8;
    uVar91 = uVar90 >> 8;
    uVar94 = uVar93 >> 8;
    uVar97 = uVar96 >> 8;
    uVar100 = uVar99 >> 8;
    uVar103 = uVar102 >> 8;
    uVar105 = sVar76 * 0x15 + sVar41;
    uVar107 = sVar83 * 0x11 + sVar43;
    uVar109 = sVar86 * 0xe + sVar44;
    uVar111 = sVar89 * 0xc + sVar45;
    uVar113 = sVar92 * 10 + sVar46;
    uVar115 = sVar95 * 9 + sVar47;
    uVar117 = sVar98 * 8 + sVar48;
    uVar119 = sVar101 * 8 + sVar49;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    *puVar40 = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar40[1] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
    puVar40[2] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar40[3] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar40[4] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar40[5] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
    puVar40[6] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar40[7] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
    puVar40[8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar40[9] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar40[10] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar40[0xb] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[0xc] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[0xd] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[0xe] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[0xf] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40 = puVar40 + stride;
  }
  uVar1 = *(ulong *)(left_column + 8);
  auVar4._8_6_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4[0xe] = (char)(uVar1 >> 0x38);
  auVar8._8_4_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8[0xc] = (char)(uVar1 >> 0x30);
  auVar8._13_2_ = auVar4._13_2_;
  auVar12._8_4_ = 0;
  auVar12._0_8_ = uVar1;
  auVar12._12_3_ = auVar8._12_3_;
  auVar16._8_2_ = 0;
  auVar16._0_8_ = uVar1;
  auVar16[10] = (char)(uVar1 >> 0x28);
  auVar16._11_4_ = auVar12._11_4_;
  auVar20._8_2_ = 0;
  auVar20._0_8_ = uVar1;
  auVar20._10_5_ = auVar16._10_5_;
  auVar23[8] = (char)(uVar1 >> 0x20);
  auVar23._0_8_ = uVar1;
  auVar23._9_6_ = auVar20._9_6_;
  auVar28._7_8_ = 0;
  auVar28._0_7_ = auVar23._8_7_;
  auVar33._1_8_ = SUB158(auVar28 << 0x40,7);
  auVar33[0] = (char)(uVar1 >> 0x18);
  auVar33._9_6_ = 0;
  auVar34._1_10_ = SUB1510(auVar33 << 0x30,5);
  auVar34[0] = (char)(uVar1 >> 0x10);
  auVar34._11_4_ = 0;
  auVar104._3_12_ = SUB1512(auVar34 << 0x20,3);
  auVar104[2] = (char)(uVar1 >> 8);
  auVar104[0] = (byte)uVar1;
  auVar104[1] = 0;
  auVar104[0xf] = 0;
  for (uVar39 = 0x1000100; uVar39 < 0xf0e0f0f; uVar39 = uVar39 + 0x2020202) {
    auVar80._4_4_ = uVar39;
    auVar80._0_4_ = uVar39;
    auVar80._8_4_ = uVar39;
    auVar80._12_4_ = uVar39;
    auVar42 = pshufb(auVar104,auVar80);
    sVar76 = auVar42._0_2_;
    sVar83 = auVar42._2_2_;
    sVar86 = auVar42._4_2_;
    sVar89 = auVar42._6_2_;
    sVar92 = auVar42._8_2_;
    sVar95 = auVar42._10_2_;
    sVar98 = auVar42._12_2_;
    sVar101 = auVar42._14_2_;
    uVar77 = sVar76 * 0xff + sVar50;
    uVar84 = sVar83 * 0xf0 + sVar51;
    uVar87 = sVar86 * 0xe1 + sVar52;
    uVar90 = sVar89 * 0xd2 + sVar53;
    uVar93 = sVar92 * 0xc4 + sVar54;
    uVar96 = sVar95 * 0xb6 + sVar55;
    uVar99 = sVar98 * 0xa9 + sVar56;
    uVar102 = sVar101 * 0x9d + sVar57;
    uVar78 = uVar77 >> 8;
    uVar85 = uVar84 >> 8;
    uVar88 = uVar87 >> 8;
    uVar91 = uVar90 >> 8;
    uVar94 = uVar93 >> 8;
    uVar97 = uVar96 >> 8;
    uVar100 = uVar99 >> 8;
    uVar103 = uVar102 >> 8;
    uVar105 = sVar76 * 0x91 + sVar58;
    uVar107 = sVar83 * 0x85 + sVar59;
    uVar109 = sVar86 * 0x7a + sVar60;
    uVar111 = sVar89 * 0x6f + sVar61;
    uVar113 = sVar92 * 0x65 + sVar62;
    uVar115 = sVar95 * 0x5c + sVar63;
    uVar117 = sVar98 * 0x53 + sVar64;
    uVar119 = sVar101 * 0x4a + sVar65;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    puVar40[-0x10] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar40[-0xf] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
    puVar40[-0xe] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar40[-0xd] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar40[-0xc] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar40[-0xb] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
    puVar40[-10] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar40[-9] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
    puVar40[-8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar40[-7] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar40[-6] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar40[-5] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[-4] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[-3] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[-2] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[-1] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    uVar77 = sVar76 * 0x42 + sVar66;
    uVar84 = sVar83 * 0x3b + sVar67;
    uVar87 = sVar86 * 0x34 + sVar68;
    uVar90 = sVar89 * 0x2d + sVar69;
    uVar93 = sVar92 * 0x27 + sVar70;
    uVar96 = sVar95 * 0x22 + sVar71;
    uVar99 = sVar98 * 0x1d + sVar72;
    uVar102 = sVar101 * 0x19 + sVar73;
    uVar78 = uVar77 >> 8;
    uVar85 = uVar84 >> 8;
    uVar88 = uVar87 >> 8;
    uVar91 = uVar90 >> 8;
    uVar94 = uVar93 >> 8;
    uVar97 = uVar96 >> 8;
    uVar100 = uVar99 >> 8;
    uVar103 = uVar102 >> 8;
    uVar105 = sVar76 * 0x15 + sVar41;
    uVar107 = sVar83 * 0x11 + sVar43;
    uVar109 = sVar86 * 0xe + sVar44;
    uVar111 = sVar89 * 0xc + sVar45;
    uVar113 = sVar92 * 10 + sVar46;
    uVar115 = sVar95 * 9 + sVar47;
    uVar117 = sVar98 * 8 + sVar48;
    uVar119 = sVar101 * 8 + sVar49;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    *puVar40 = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar40[1] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
    puVar40[2] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar40[3] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar40[4] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar40[5] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
    puVar40[6] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar40[7] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
    puVar40[8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar40[9] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar40[10] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar40[0xb] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[0xc] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[0xd] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[0xe] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[0xf] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40 = puVar40 + stride;
  }
  uVar1 = *(ulong *)(left_column + 0x10);
  auVar5._8_6_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[0xe] = (char)(uVar1 >> 0x38);
  auVar9._8_4_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9[0xc] = (char)(uVar1 >> 0x30);
  auVar9._13_2_ = auVar5._13_2_;
  auVar13._8_4_ = 0;
  auVar13._0_8_ = uVar1;
  auVar13._12_3_ = auVar9._12_3_;
  auVar17._8_2_ = 0;
  auVar17._0_8_ = uVar1;
  auVar17[10] = (char)(uVar1 >> 0x28);
  auVar17._11_4_ = auVar13._11_4_;
  auVar21._8_2_ = 0;
  auVar21._0_8_ = uVar1;
  auVar21._10_5_ = auVar17._10_5_;
  auVar24[8] = (char)(uVar1 >> 0x20);
  auVar24._0_8_ = uVar1;
  auVar24._9_6_ = auVar21._9_6_;
  auVar29._7_8_ = 0;
  auVar29._0_7_ = auVar24._8_7_;
  auVar35._1_8_ = SUB158(auVar29 << 0x40,7);
  auVar35[0] = (char)(uVar1 >> 0x18);
  auVar35._9_6_ = 0;
  auVar36._1_10_ = SUB1510(auVar35 << 0x30,5);
  auVar36[0] = (char)(uVar1 >> 0x10);
  auVar36._11_4_ = 0;
  auVar74._3_12_ = SUB1512(auVar36 << 0x20,3);
  auVar74[2] = (char)(uVar1 >> 8);
  auVar74[0] = (byte)uVar1;
  auVar74[1] = 0;
  auVar74[0xf] = 0;
  for (uVar39 = 0x1000100; uVar39 < 0xf0e0f0f; uVar39 = uVar39 + 0x2020202) {
    auVar81._4_4_ = uVar39;
    auVar81._0_4_ = uVar39;
    auVar81._8_4_ = uVar39;
    auVar81._12_4_ = uVar39;
    auVar42 = pshufb(auVar74,auVar81);
    sVar76 = auVar42._0_2_;
    sVar83 = auVar42._2_2_;
    sVar86 = auVar42._4_2_;
    sVar89 = auVar42._6_2_;
    sVar92 = auVar42._8_2_;
    sVar95 = auVar42._10_2_;
    sVar98 = auVar42._12_2_;
    sVar101 = auVar42._14_2_;
    uVar77 = sVar76 * 0xff + sVar50;
    uVar84 = sVar83 * 0xf0 + sVar51;
    uVar87 = sVar86 * 0xe1 + sVar52;
    uVar90 = sVar89 * 0xd2 + sVar53;
    uVar93 = sVar92 * 0xc4 + sVar54;
    uVar96 = sVar95 * 0xb6 + sVar55;
    uVar99 = sVar98 * 0xa9 + sVar56;
    uVar102 = sVar101 * 0x9d + sVar57;
    uVar78 = uVar77 >> 8;
    uVar85 = uVar84 >> 8;
    uVar88 = uVar87 >> 8;
    uVar91 = uVar90 >> 8;
    uVar94 = uVar93 >> 8;
    uVar97 = uVar96 >> 8;
    uVar100 = uVar99 >> 8;
    uVar103 = uVar102 >> 8;
    uVar105 = sVar76 * 0x91 + sVar58;
    uVar107 = sVar83 * 0x85 + sVar59;
    uVar109 = sVar86 * 0x7a + sVar60;
    uVar111 = sVar89 * 0x6f + sVar61;
    uVar113 = sVar92 * 0x65 + sVar62;
    uVar115 = sVar95 * 0x5c + sVar63;
    uVar117 = sVar98 * 0x53 + sVar64;
    uVar119 = sVar101 * 0x4a + sVar65;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    puVar40[-0x10] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar40[-0xf] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
    puVar40[-0xe] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar40[-0xd] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar40[-0xc] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar40[-0xb] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
    puVar40[-10] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar40[-9] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
    puVar40[-8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar40[-7] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar40[-6] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar40[-5] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[-4] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[-3] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[-2] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[-1] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    uVar77 = sVar76 * 0x42 + sVar66;
    uVar84 = sVar83 * 0x3b + sVar67;
    uVar87 = sVar86 * 0x34 + sVar68;
    uVar90 = sVar89 * 0x2d + sVar69;
    uVar93 = sVar92 * 0x27 + sVar70;
    uVar96 = sVar95 * 0x22 + sVar71;
    uVar99 = sVar98 * 0x1d + sVar72;
    uVar102 = sVar101 * 0x19 + sVar73;
    uVar78 = uVar77 >> 8;
    uVar85 = uVar84 >> 8;
    uVar88 = uVar87 >> 8;
    uVar91 = uVar90 >> 8;
    uVar94 = uVar93 >> 8;
    uVar97 = uVar96 >> 8;
    uVar100 = uVar99 >> 8;
    uVar103 = uVar102 >> 8;
    uVar105 = sVar76 * 0x15 + sVar41;
    uVar107 = sVar83 * 0x11 + sVar43;
    uVar109 = sVar86 * 0xe + sVar44;
    uVar111 = sVar89 * 0xc + sVar45;
    uVar113 = sVar92 * 10 + sVar46;
    uVar115 = sVar95 * 9 + sVar47;
    uVar117 = sVar98 * 8 + sVar48;
    uVar119 = sVar101 * 8 + sVar49;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    *puVar40 = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar40[1] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
    puVar40[2] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar40[3] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar40[4] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar40[5] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
    puVar40[6] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar40[7] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
    puVar40[8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar40[9] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar40[10] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar40[0xb] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[0xc] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[0xd] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[0xe] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[0xf] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40 = puVar40 + stride;
  }
  uVar1 = *(ulong *)(left_column + 0x18);
  auVar6._8_6_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6[0xe] = (char)(uVar1 >> 0x38);
  auVar10._8_4_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10[0xc] = (char)(uVar1 >> 0x30);
  auVar10._13_2_ = auVar6._13_2_;
  auVar14._8_4_ = 0;
  auVar14._0_8_ = uVar1;
  auVar14._12_3_ = auVar10._12_3_;
  auVar18._8_2_ = 0;
  auVar18._0_8_ = uVar1;
  auVar18[10] = (char)(uVar1 >> 0x28);
  auVar18._11_4_ = auVar14._11_4_;
  auVar22._8_2_ = 0;
  auVar22._0_8_ = uVar1;
  auVar22._10_5_ = auVar18._10_5_;
  auVar25[8] = (char)(uVar1 >> 0x20);
  auVar25._0_8_ = uVar1;
  auVar25._9_6_ = auVar22._9_6_;
  auVar30._7_8_ = 0;
  auVar30._0_7_ = auVar25._8_7_;
  auVar37._1_8_ = SUB158(auVar30 << 0x40,7);
  auVar37[0] = (char)(uVar1 >> 0x18);
  auVar37._9_6_ = 0;
  auVar38._1_10_ = SUB1510(auVar37 << 0x30,5);
  auVar38[0] = (char)(uVar1 >> 0x10);
  auVar38._11_4_ = 0;
  auVar75._3_12_ = SUB1512(auVar38 << 0x20,3);
  auVar75[2] = (char)(uVar1 >> 8);
  auVar75[0] = (byte)uVar1;
  auVar75[1] = 0;
  auVar75[0xf] = 0;
  for (uVar39 = 0x1000100; uVar39 < 0xf0e0f0f; uVar39 = uVar39 + 0x2020202) {
    auVar82._4_4_ = uVar39;
    auVar82._0_4_ = uVar39;
    auVar82._8_4_ = uVar39;
    auVar82._12_4_ = uVar39;
    auVar42 = pshufb(auVar75,auVar82);
    sVar76 = auVar42._0_2_;
    sVar83 = auVar42._2_2_;
    sVar86 = auVar42._4_2_;
    sVar89 = auVar42._6_2_;
    sVar92 = auVar42._8_2_;
    sVar95 = auVar42._10_2_;
    sVar98 = auVar42._12_2_;
    sVar101 = auVar42._14_2_;
    uVar77 = sVar76 * 0xff + sVar50;
    uVar84 = sVar83 * 0xf0 + sVar51;
    uVar87 = sVar86 * 0xe1 + sVar52;
    uVar90 = sVar89 * 0xd2 + sVar53;
    uVar93 = sVar92 * 0xc4 + sVar54;
    uVar96 = sVar95 * 0xb6 + sVar55;
    uVar99 = sVar98 * 0xa9 + sVar56;
    uVar102 = sVar101 * 0x9d + sVar57;
    uVar78 = uVar77 >> 8;
    uVar85 = uVar84 >> 8;
    uVar88 = uVar87 >> 8;
    uVar91 = uVar90 >> 8;
    uVar94 = uVar93 >> 8;
    uVar97 = uVar96 >> 8;
    uVar100 = uVar99 >> 8;
    uVar103 = uVar102 >> 8;
    uVar105 = sVar76 * 0x91 + sVar58;
    uVar107 = sVar83 * 0x85 + sVar59;
    uVar109 = sVar86 * 0x7a + sVar60;
    uVar111 = sVar89 * 0x6f + sVar61;
    uVar113 = sVar92 * 0x65 + sVar62;
    uVar115 = sVar95 * 0x5c + sVar63;
    uVar117 = sVar98 * 0x53 + sVar64;
    uVar119 = sVar101 * 0x4a + sVar65;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    puVar40[-0x10] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar40[-0xf] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
    puVar40[-0xe] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar40[-0xd] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar40[-0xc] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar40[-0xb] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
    puVar40[-10] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar40[-9] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
    puVar40[-8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar40[-7] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar40[-6] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar40[-5] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[-4] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[-3] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[-2] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[-1] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    uVar77 = sVar76 * 0x42 + sVar66;
    uVar84 = sVar83 * 0x3b + sVar67;
    uVar87 = sVar86 * 0x34 + sVar68;
    uVar90 = sVar89 * 0x2d + sVar69;
    uVar93 = sVar92 * 0x27 + sVar70;
    uVar96 = sVar95 * 0x22 + sVar71;
    uVar99 = sVar98 * 0x1d + sVar72;
    uVar102 = sVar101 * 0x19 + sVar73;
    uVar78 = uVar77 >> 8;
    uVar85 = uVar84 >> 8;
    uVar88 = uVar87 >> 8;
    uVar91 = uVar90 >> 8;
    uVar94 = uVar93 >> 8;
    uVar97 = uVar96 >> 8;
    uVar100 = uVar99 >> 8;
    uVar103 = uVar102 >> 8;
    uVar105 = sVar76 * 0x15 + sVar41;
    uVar107 = sVar83 * 0x11 + sVar43;
    uVar109 = sVar86 * 0xe + sVar44;
    uVar111 = sVar89 * 0xc + sVar45;
    uVar113 = sVar92 * 10 + sVar46;
    uVar115 = sVar95 * 9 + sVar47;
    uVar117 = sVar98 * 8 + sVar48;
    uVar119 = sVar101 * 8 + sVar49;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    *puVar40 = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar40[1] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
    puVar40[2] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar40[3] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar40[4] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar40[5] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
    puVar40[6] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar40[7] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
    puVar40[8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar40[9] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar40[10] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar40[0xb] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[0xc] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[0xd] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[0xe] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[0xf] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40 = puVar40 + stride;
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_32x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[31]);
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights_lo, 8));
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = cvtepu8_epi16(_mm_srli_si128(weights_hi, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i scaled_top_right3 =
      _mm_mullo_epi16(inverted_weights3, top_right);
  const __m128i scaled_top_right4 =
      _mm_mullo_epi16(inverted_weights4, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i left = cvtepu8_epi16(LoadLo8(left_column));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 16));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 24));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    dst += stride;
  }
}